

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O2

void __thiscall gmath::Camera::getProperties(Camera *this,Properties *prop,int id)

{
  _Alloc_hider _Var1;
  string local_48;
  
  getCameraKey_abi_cxx11_(&local_48,(Camera *)prop,"R",id);
  _Var1._M_p = local_48._M_dataplus._M_p;
  gutil::Properties::putValue<gmath::SMatrix<double,3,3>>(prop,local_48._M_dataplus._M_p,&this->R);
  std::__cxx11::string::~string((string *)&local_48);
  getCameraKey_abi_cxx11_(&local_48,(Camera *)_Var1._M_p,"T",id);
  _Var1._M_p = local_48._M_dataplus._M_p;
  gutil::Properties::putValue<gmath::SVector<double,3>>(prop,local_48._M_dataplus._M_p,&this->T);
  std::__cxx11::string::~string((string *)&local_48);
  if (this->width != 0) {
    getCameraKey_abi_cxx11_(&local_48,(Camera *)_Var1._M_p,"width",id);
    _Var1._M_p = local_48._M_dataplus._M_p;
    gutil::Properties::putValue<long>(prop,local_48._M_dataplus._M_p,&this->width);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if (this->height != 0) {
    getCameraKey_abi_cxx11_(&local_48,(Camera *)_Var1._M_p,"height",id);
    _Var1._M_p = local_48._M_dataplus._M_p;
    gutil::Properties::putValue<long>(prop,local_48._M_dataplus._M_p,&this->height);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if ((((this->zmin != 0.0) || (NAN(this->zmin))) || (this->zmax != 1.79769313486232e+308)) ||
     (NAN(this->zmax))) {
    getCameraKey_abi_cxx11_(&local_48,(Camera *)_Var1._M_p,"zmin",id);
    _Var1._M_p = local_48._M_dataplus._M_p;
    gutil::Properties::putValue<double>(prop,local_48._M_dataplus._M_p,&this->zmin);
    std::__cxx11::string::~string((string *)&local_48);
    getCameraKey_abi_cxx11_(&local_48,(Camera *)_Var1._M_p,"zmax",id);
    _Var1._M_p = local_48._M_dataplus._M_p;
    gutil::Properties::putValue<double>(prop,local_48._M_dataplus._M_p,&this->zmax);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if ((this->match).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->match).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    getCameraKey_abi_cxx11_(&local_48,(Camera *)_Var1._M_p,"match",id);
    gutil::Properties::putValueVector<std::__cxx11::string>
              (prop,local_48._M_dataplus._M_p,&this->match,',');
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void Camera::getProperties(gutil::Properties &prop, int id) const
{
  prop.putValue(getCameraKey("R", id).c_str(), R);
  prop.putValue(getCameraKey("T", id).c_str(), T);

  if (width != 0)
  {
    prop.putValue(getCameraKey("width", id).c_str(), width);
  }

  if (height != 0)
  {
    prop.putValue(getCameraKey("height", id).c_str(), height);
  }

  if (zmin != 0 || zmax != std::numeric_limits<double>::max())
  {
    prop.putValue(getCameraKey("zmin", id).c_str(), zmin);
    prop.putValue(getCameraKey("zmax", id).c_str(), zmax);
  }

  if (match.size() > 0)
  {
    prop.putStringVector(getCameraKey("match", id).c_str(), match, ',');
  }
}